

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O3

void p_error_clear(PError *error)

{
  if (error != (PError *)0x0) {
    if (error->message != (pchar *)0x0) {
      p_free(error->message);
    }
    error->code = 0;
    error->native_code = 0;
    error->message = (pchar *)0x0;
  }
  return;
}

Assistant:

P_LIB_API void
p_error_clear (PError *error)
{
	if (P_UNLIKELY (error == NULL))
		return;

	if (error->message != NULL)
		p_free (error->message);

	error->message     = NULL;
	error->code        = 0;
	error->native_code = 0;
}